

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_stream_info *si;
  uint64_t uVar2;
  long lVar3;
  void *pvVar4;
  wchar_t wVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  int64_t iVar9;
  uint32_t *puVar10;
  archive_string_conv *paVar11;
  int *piVar12;
  undefined8 *__ptr;
  undefined8 *puVar13;
  uchar *puVar14;
  char *pcVar15;
  char *pcVar16;
  _7z_folder *p_Var17;
  size_t len;
  uint uVar18;
  uint64_t *puVar19;
  ulong uVar20;
  char *pcVar21;
  _7z_folder *p_Var22;
  uint64_t *puVar23;
  char *p;
  long lVar24;
  bool bVar25;
  int64_t offset;
  size_t size;
  _7z_header_info header;
  int local_78;
  long local_68;
  ulong local_60;
  _7z_header_info local_58;
  
  si = (_7z_stream_info *)a->format->data;
  if ((int)si[0xc6].ss.unpack_streams == -1) {
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    local_58.emptyFileBools = (uchar *)0x0;
    local_58.antiBools = (uchar *)0x0;
    local_58.dataIndex = 0;
    local_58.emptyStreamBools = (uchar *)0x0;
    local_58.attrBools = (uchar *)0x0;
    piVar12 = (int *)__archive_read_ahead(a,0x20,&local_68);
    if (piVar12 == (int *)0x0) {
LAB_0016b4a4:
      local_78 = -0x1e;
      bVar25 = false;
    }
    else {
      if ((((char)*piVar12 == 'M') && (*(char *)((long)piVar12 + 1) == 'Z')) ||
         (*piVar12 == 0x464c457f)) {
        if (local_68 < 0x27001) {
          iVar9 = __archive_read_seek(a,0x27000,0);
          if (iVar9 < 0) goto LAB_0016b4a4;
        }
        else {
          __archive_read_consume(a,0x27000);
        }
        lVar24 = 0;
        uVar20 = 1;
        do {
          while (pcVar15 = (char *)__archive_read_ahead(a,uVar20,(ssize_t *)&local_60),
                pcVar15 == (char *)0x0) {
            if (uVar20 < 0x80) goto LAB_0016b489;
            uVar7 = uVar20 >> 1;
LAB_0016b442:
            uVar20 = uVar7;
            if (0x39000 < uVar7 + lVar24) goto LAB_0016b489;
          }
          uVar7 = 0x1000;
          if ((long)local_60 < 6) goto LAB_0016b442;
          pcVar16 = pcVar15;
          if (0x20 < local_60) {
            pcVar21 = pcVar15 + local_60;
            p = pcVar15;
            do {
              uVar18 = check_7zip_header_in_sfx(p);
              if (uVar18 == 0) {
                pvVar4 = a->format->data;
                __archive_read_consume(a,(long)p - (long)pcVar15);
                *(long *)((long)pvVar4 + 0x88) = lVar24 + ((long)p - (long)pcVar15) + 0x27000;
                piVar12 = (int *)__archive_read_ahead(a,0x20,&local_68);
                if (piVar12 == (int *)0x0) goto LAB_0016b4a4;
                goto LAB_0016b346;
              }
              pcVar16 = p + uVar18;
              pcVar8 = p + (ulong)uVar18 + 0x20;
              p = pcVar16;
            } while (pcVar8 < pcVar21);
          }
          __archive_read_consume(a,(long)pcVar16 - (long)pcVar15);
          lVar24 = lVar24 + ((long)pcVar16 - (long)pcVar15);
          if (uVar20 == 1) {
            uVar20 = 0x1000;
          }
        } while (lVar24 + uVar20 < 0x39001);
LAB_0016b489:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        goto LAB_0016b4a4;
      }
LAB_0016b346:
      local_78 = -0x1e;
      ppuVar1 = &si[1].pi.digest.digests;
      *ppuVar1 = *ppuVar1 + 8;
      if ((short)piVar12[1] == 0x1c27 && *piVar12 == -0x504385c9) {
        uVar20 = crc32(0,piVar12 + 3,0x14);
        if (uVar20 != (uint)piVar12[2]) {
          pcVar15 = "Header CRC error";
          goto LAB_0016b540;
        }
        uVar2 = *(uint64_t *)(piVar12 + 5);
        if (uVar2 == 0) {
          local_78 = 1;
          bVar25 = false;
          goto LAB_0016b54f;
        }
        if ((long)((ulong)(uint)piVar12[4] << 0x20) < 0) {
          pcVar15 = "Malformed 7-Zip archive";
          goto LAB_0016b540;
        }
        puVar19 = (uint64_t *)CONCAT44(piVar12[4],piVar12[3]);
        puVar23 = (uint64_t *)(ulong)(uint)piVar12[7];
        __archive_read_consume(a,0x20);
        if (puVar19 != (uint64_t *)0x0) {
          if (local_68 < (long)puVar19) {
            bVar25 = false;
            iVar9 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar19,0);
            if (iVar9 < 0) goto LAB_0016b54f;
          }
          else {
            __archive_read_consume(a,(int64_t)puVar19);
          }
        }
        si[2].pi.positions = puVar19;
        si[1].pi.digest.defineds = (uchar *)puVar19;
        si[1].pi.numPackStreams = uVar2;
        si[1].pi.sizes = (uint64_t *)0x0;
        si[1].pi.pos = 1;
        *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
        puVar14 = header_bytes(a,1);
        if (puVar14 == (uchar *)0x0) {
          pcVar15 = "Truncated 7-Zip file body";
          iVar6 = 0x54;
          goto LAB_0016b548;
        }
        if (*puVar14 == '\x01') {
          bVar25 = false;
LAB_0016bb2d:
          piVar12 = __errno_location();
          *piVar12 = 0;
          iVar6 = read_Header(a,&local_58,*(int *)((long)&si[1].pi.pos + 4));
          if (iVar6 < 0) {
            if (*piVar12 == 0xc) {
              pcVar15 = "Couldn\'t allocate memory";
            }
            else {
              pcVar15 = "Damaged 7-Zip archive";
            }
          }
          else {
            puVar14 = header_bytes(a,1);
            if ((puVar14 != (uchar *)0x0) && (*puVar14 == '\0')) {
              if ((!bVar25) && (si[1].pi.sizes != puVar23)) {
                pcVar15 = "Malformed 7-Zip archive";
                goto LAB_0016b540;
              }
              si[2].pi.digest.digests = (uint32_t *)0x0;
              local_78 = 0;
              si[2].ss.unpackSizes = (uint64_t *)0x0;
              *(undefined4 *)&si[1].pi.pos = 0;
              si[2].ci.folders = (_7z_folder *)0x0;
              si[2].ci.dataStreamIndex = 0;
              bVar25 = true;
              goto LAB_0016b54f;
            }
            pcVar15 = "Malformed 7-Zip archive";
          }
          bVar25 = false;
          archive_set_error(&a->archive,-1,pcVar15);
        }
        else if (*puVar14 == '\x17') {
          iVar6 = decode_encoded_header_info(a,si);
          bVar25 = true;
          if (iVar6 == 0) {
            if (si[1].pi.sizes == puVar23) {
              p_Var22 = (si->ci).folders;
              bVar25 = p_Var22->digest_defined != '\0';
              if (bVar25) {
                puVar23 = (uint64_t *)(ulong)p_Var22->digest;
              }
              if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                read_consume(a);
                p_Var22 = (si->ci).folders;
              }
              iVar6 = setup_decode_folder(a,p_Var22,1);
              if (iVar6 == 0) {
                si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                iVar6 = seek_pack(a);
              }
            }
            else {
              iVar6 = -1;
              archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
              bVar25 = true;
            }
          }
          free_StreamsInfo(si);
          (si->ss).unpackSizes = (uint64_t *)0x0;
          (si->ss).digestsDefined = (uchar *)0x0;
          (si->ci).dataStreamIndex = 0;
          (si->ss).unpack_streams = 0;
          (si->ci).numFolders = 0;
          (si->ci).folders = (_7z_folder *)0x0;
          (si->pi).digest.digests = (uint32_t *)0x0;
          (si->pi).positions = (uint64_t *)0x0;
          (si->pi).sizes = (uint64_t *)0x0;
          (si->pi).digest.defineds = (uchar *)0x0;
          (si->pi).pos = 0;
          (si->pi).numPackStreams = 0;
          (si->ss).digests = (uint32_t *)0x0;
          if (-1 < iVar6) {
            *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
            si[1].pi.sizes = (uint64_t *)0x0;
            bVar25 = !bVar25;
            goto LAB_0016bb2d;
          }
          bVar25 = false;
        }
        else {
          bVar25 = false;
          archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
        }
      }
      else {
        pcVar15 = "Not 7-Zip archive file";
LAB_0016b540:
        iVar6 = -1;
LAB_0016b548:
        bVar25 = false;
        archive_set_error(&a->archive,iVar6,pcVar15);
      }
    }
LAB_0016b54f:
    free(local_58.emptyStreamBools);
    free(local_58.emptyFileBools);
    free(local_58.antiBools);
    free(local_58.attrBools);
    if (!bVar25) {
      return local_78;
    }
    puVar19 = (uint64_t *)si[1].ci.numFolders;
    p_Var22 = si[1].ci.folders;
    si[1].pi.positions = puVar19;
    si[1].ci.dataStreamIndex = (uint64_t)p_Var22;
  }
  else {
    puVar19 = si[1].pi.positions;
    p_Var22 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x50);
    si[1].ci.dataStreamIndex = (uint64_t)p_Var22;
  }
  if (p_Var22 == (_7z_folder *)0x0 || puVar19 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar19 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar10 = (uint32_t *)crc32(0,0,0);
  si[1].ss.digests = puVar10;
  if (si[0xc6].pi.pos == 0) {
    paVar11 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
    si[0xc6].pi.pos = (uint64_t)paVar11;
    if (paVar11 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  uVar20 = (ulong)(uint)p_Var22->numBindPairs;
  if (((uVar20 < (si->ci).numFolders) && (p_Var17 = (si->ci).folders, p_Var17 != (_7z_folder *)0x0))
     && (p_Var17 = p_Var17 + uVar20, p_Var17->numCoders != 0)) {
    lVar24 = 0;
    uVar20 = 0;
    do {
      lVar3 = *(long *)((long)&p_Var17->coders->codec + lVar24);
      if (((lVar3 == 0x6f10101) || (lVar3 == 0x6f10701)) || (lVar3 == 0x6f10303)) {
        archive_entry_set_is_data_encrypted(entry,'\x01');
        *(undefined4 *)&si[0xc6].ss.unpack_streams = 1;
      }
      uVar20 = uVar20 + 1;
      lVar24 = lVar24 + 0x28;
    } while (uVar20 < p_Var17->numCoders);
  }
  if ((int)si[0xc6].ss.unpack_streams == -1) {
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
  }
  wVar5 = _archive_entry_copy_pathname_l
                    (entry,(char *)p_Var22->coders,p_Var22->numCoders,
                     (archive_string_conv *)si[0xc6].pi.pos);
  if (wVar5 == L'\0') {
    local_78 = 0;
  }
  else {
    piVar12 = __errno_location();
    if (*piVar12 == 0xc) {
      pcVar15 = "Can\'t allocate memory for Pathname";
LAB_0016b6cf:
      archive_set_error(&a->archive,0xc,pcVar15);
      return -0x1e;
    }
    pcVar15 = archive_string_conversion_charset_name((archive_string_conv *)si[0xc6].pi.pos);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar15);
    local_78 = -0x14;
  }
  archive_entry_set_mode(entry,*(mode_t *)((long)&p_Var22->unPackSize + 4));
  uVar18 = *(uint *)&p_Var22->bindPairs;
  if ((uVar18 & 1) != 0) {
    archive_entry_set_mtime(entry,p_Var22->numPackedStreams,(ulong)(uint)p_Var22->numOutStreams);
    uVar18 = *(uint *)&p_Var22->bindPairs;
  }
  if ((uVar18 & 4) != 0) {
    archive_entry_set_ctime(entry,p_Var22->numInStreams,(ulong)*(uint *)&p_Var22->unPackSize);
    uVar18 = *(uint *)&p_Var22->bindPairs;
  }
  if ((uVar18 & 2) != 0) {
    archive_entry_set_atime
              (entry,(time_t)p_Var22->packedStreams,
               (ulong)*(uint *)((long)&p_Var22->numOutStreams + 4));
  }
  uVar20 = (ulong)*(uint *)((long)&p_Var22->numBindPairs + 4);
  if (uVar20 == 0xffffffff) {
    puVar14 = (uchar *)0x0;
  }
  else {
    puVar14 = (uchar *)(si->ss).unpackSizes[uVar20];
  }
  si[1].ss.digestsDefined = puVar14;
  archive_entry_set_size(entry,(la_int64_t)puVar14);
  uVar18 = *(uint *)&p_Var22->digest_defined;
  if (((uVar18 & 7) != 0) && (__ptr = (undefined8 *)malloc(0x16), __ptr != (undefined8 *)0x0)) {
    puVar13 = __ptr;
    if ((uVar18 & 1) != 0) {
      *__ptr = 0x796c6e6f64722c;
      puVar13 = (undefined8 *)((long)__ptr + 7);
    }
    if ((uVar18 & 2) != 0) {
      *puVar13 = 0x6e65646469682c;
      puVar13 = (undefined8 *)((long)puVar13 + 7);
    }
    if ((uVar18 & 4) != 0) {
      *puVar13 = 0x6d65747379732c;
      puVar13 = (undefined8 *)((long)puVar13 + 7);
    }
    if (__ptr < puVar13) {
      archive_entry_copy_fflags_text(entry,(char *)((long)__ptr + 1));
    }
    free(__ptr);
  }
  if (si[1].ss.digestsDefined == (uchar *)0x0) {
    *(undefined1 *)&si[2].pi.pos = 1;
    if (((ulong)p_Var22->unPackSize & 0xf00000000000) != 0xa00000000000) goto LAB_0016b945;
    pcVar15 = (char *)0x0;
LAB_0016b90f:
    uVar18 = *(uint *)((long)&p_Var22->unPackSize + 4) & 0xffff0fff | 0x8000;
    *(uint *)((long)&p_Var22->unPackSize + 4) = uVar18;
    archive_entry_set_mode(entry,uVar18);
  }
  else {
    if (((ulong)p_Var22->unPackSize & 0xf00000000000) != 0xa00000000000) goto LAB_0016b945;
    len = 0;
    pcVar16 = (char *)0x0;
    do {
      iVar6 = archive_read_format_7zip_read_data(a,(void **)&local_58,&local_60,&local_68);
      uVar20 = local_60;
      if (iVar6 < -0x14) {
        free(pcVar16);
        return iVar6;
      }
      pcVar15 = (char *)realloc(pcVar16,local_60 + len + 1);
      if (pcVar15 == (char *)0x0) {
        free(pcVar16);
        pcVar15 = "Can\'t allocate memory for Symname";
        goto LAB_0016b6cf;
      }
      memcpy(pcVar15 + len,(void *)local_58.dataIndex,uVar20);
      len = len + uVar20;
      pcVar16 = pcVar15;
    } while (si[1].ss.digestsDefined != (uchar *)0x0);
    if (len == 0) goto LAB_0016b90f;
    pcVar15[len] = '\0';
    paVar11 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (paVar11 == (archive_string_conv *)0x0) {
      free(pcVar15);
      return -0x1e;
    }
    _archive_entry_copy_symlink_l(entry,pcVar15,len,paVar11);
  }
  free(pcVar15);
  archive_entry_set_size(entry,0);
LAB_0016b945:
  *(undefined2 *)((long)&si[0xc6].pi.numPackStreams + 4) = 0x70;
  *(undefined4 *)&si[0xc6].pi.numPackStreams = 0x695a2d37;
  (a->archive).archive_format_name = (char *)&si[0xc6].pi.numPackStreams;
  return local_78;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	// These attributes are supported by the windows implementation of archive_write_disk.
	const int supported_attrs = FILE_ATTRIBUTE_READONLY | FILE_ATTRIBUTE_HIDDEN | FILE_ATTRIBUTE_SYSTEM;

	if (zip_entry->attr & supported_attrs) {
		char *fflags_text, *ptr;
		/* allocate for ",rdonly,hidden,system" */
		fflags_text = malloc(22 * sizeof(*fflags_text));
		if (fflags_text != NULL) {
			ptr = fflags_text;
			if (zip_entry->attr & FILE_ATTRIBUTE_READONLY) {
				strcpy(ptr, ",rdonly");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_HIDDEN) {
				strcpy(ptr, ",hidden");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_SYSTEM) {
				strcpy(ptr, ",system");
				ptr = ptr + 7;
			}
			if (ptr > fflags_text) {
				archive_entry_copy_fflags_text(entry,
				    fflags_text + 1);
			}
			free(fflags_text);
		}
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			struct archive_string_conv* utf8_conv;

			symname[symsize] = '\0';

			/* Symbolic links are embedded as UTF-8 strings */
			utf8_conv = archive_string_conversion_from_charset(&a->archive,
			    "UTF-8", 1);
			if (utf8_conv == NULL) {
				free(symname);
				return ARCHIVE_FATAL;
			}

			archive_entry_copy_symlink_l(entry, (const char*)symname, symsize,
			    utf8_conv);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}